

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::FormatString<char[92],char_const*,char[31],char_const*,char[38]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [92],char **Args_1,
          char (*Args_2) [31],char **Args_3,char (*Args_4) [38])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[92],char_const*,char[31],char_const*,char[38]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [92])this,(char **)Args,(char (*) [31])Args_1,(char **)Args_2,
             (char (*) [38])Args_3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}